

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listTest.cpp
# Opt level: O0

void printr<ft::list<int,ft::allocator<int>>>(list<int,_ft::allocator<int>_> *t,char *s)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  const_reverse_iterator local_78;
  const_reverse_iterator local_60;
  int local_34;
  undefined1 local_30 [8];
  const_reverse_iterator itr;
  char *s_local;
  list<int,_ft::allocator<int>_> *t_local;
  
  itr.current.super_listIterator<int>.m_node = (Node *)s;
  ft::reverse_iterator<ft::constListIterator<int>_>::reverse_iterator
            ((reverse_iterator<ft::constListIterator<int>_> *)local_30);
  local_34 = (int)std::setw(3);
  poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)local_34);
  poVar2 = std::operator<<(poVar2,(char *)itr.current.super_listIterator<int>.m_node);
  std::operator<<(poVar2," in reverse:");
  ft::list<int,_ft::allocator<int>_>::rbegin(&local_60,t);
  ft::reverse_iterator<ft::constListIterator<int>_>::operator=
            ((reverse_iterator<ft::constListIterator<int>_> *)local_30,&local_60);
  ft::reverse_iterator<ft::constListIterator<int>_>::~reverse_iterator(&local_60);
  while( true ) {
    ft::list<int,_ft::allocator<int>_>::rend(&local_78,t);
    bVar1 = ft::operator!=((reverse_iterator<ft::constListIterator<int>_> *)local_30,&local_78);
    ft::reverse_iterator<ft::constListIterator<int>_>::~reverse_iterator(&local_78);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,' ');
    pvVar3 = ft::reverse_iterator<ft::constListIterator<int>_>::operator*
                       ((reverse_iterator<ft::constListIterator<int>_> *)local_30);
    std::ostream::operator<<(poVar2,*pvVar3);
    ft::reverse_iterator<ft::constListIterator<int>_>::operator++
              ((reverse_iterator<ft::constListIterator<int>_> *)local_30);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  ft::reverse_iterator<ft::constListIterator<int>_>::~reverse_iterator
            ((reverse_iterator<ft::constListIterator<int>_> *)local_30);
  return;
}

Assistant:

void	printr(T const & t, char const * s) {
	typename T::const_reverse_iterator	itr;

	std::cout << std::setw(3) << s << " in reverse:";
	for (itr = t.rbegin(); itr != t.rend(); ++itr)
		std::cout << ' ' << *itr;
	std::cout << std::endl;
}